

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  uchar **ppuVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  size_type sVar8;
  reference pvVar9;
  void *pvVar10;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  char *in_R8;
  int i_4;
  uchar **src_1;
  int srcIdx_1;
  int idx_1;
  int jj_1;
  int ii_1;
  int i_3;
  int j_1;
  int it_1;
  float val;
  int i_2;
  uchar **src;
  int srcIdx;
  int idx;
  int jj;
  int ii;
  int i_1;
  int j;
  int it;
  int chIdx;
  LayerChannel *ch;
  size_t c;
  size_t ch_count;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret_2;
  int i;
  int ret_1;
  stringstream ss;
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader *in_stack_fffffffffffffb08;
  string *in_stack_fffffffffffffb10;
  string *msg;
  EXRImage *in_stack_fffffffffffffb18;
  EXRImage *exr_image_00;
  allocator *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2c;
  undefined1 in_stack_fffffffffffffb2d;
  undefined1 in_stack_fffffffffffffb2e;
  undefined1 in_stack_fffffffffffffb2f;
  size_type local_4d0;
  int local_47c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  int local_460;
  int local_45c;
  int local_458;
  undefined1 local_451 [40];
  undefined1 local_429 [40];
  allocator local_401;
  string local_400 [32];
  undefined4 local_3e0;
  int local_3dc;
  uchar **local_3d8;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  int iVar11;
  undefined4 in_stack_fffffffffffffc44;
  int iVar12;
  int local_3b8;
  size_type local_3a8;
  char **in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  EXRHeader *in_stack_fffffffffffffc70;
  EXRImage *in_stack_fffffffffffffc78;
  EXRVersion *in_stack_fffffffffffffc80;
  EXRHeader *in_stack_fffffffffffffc88;
  allocator local_36b;
  byte local_36a;
  allocator local_369;
  string local_368 [32];
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_348 [2];
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  stringstream local_2b8 [16];
  ostream local_2a8 [380];
  int local_12c;
  int local_f0;
  int local_ec;
  int local_e8;
  long local_b8;
  int local_b0;
  long local_a8;
  EXRImage local_a0;
  int local_74;
  int local_70;
  allocator local_59;
  string local_58 [40];
  char *local_30;
  int *local_20;
  int *local_18;
  long *local_10;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Invalid argument for LoadEXR()",&local_59);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffb10,(char **)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    return -3;
  }
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  InitEXRHeader((EXRHeader *)0x1dea5a);
  InitEXRImage(&local_a0);
  local_12c = ParseEXRVersionFromFile
                        ((EXRVersion *)
                         CONCAT17(in_stack_fffffffffffffb2f,
                                  CONCAT16(in_stack_fffffffffffffb2e,
                                           CONCAT15(in_stack_fffffffffffffb2d,
                                                    CONCAT14(in_stack_fffffffffffffb2c,
                                                             in_stack_fffffffffffffb28)))),
                         (char *)in_stack_fffffffffffffb20);
  if (local_12c != 0) {
    std::__cxx11::stringstream::stringstream(local_2b8);
    poVar7 = std::operator<<(local_2a8,
                             "Failed to open EXR file or read version info from EXR file. code(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_12c);
    std::operator<<(poVar7,")");
    std::__cxx11::stringstream::str();
    tinyexr::SetErrorMessage(in_stack_fffffffffffffb10,(char **)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_2d8);
    local_4 = local_12c;
    std::__cxx11::stringstream::~stringstream(local_2b8);
    return local_4;
  }
  if ((local_70 != 0) || (local_74 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2f8,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
               &local_2f9);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffb10,(char **)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    return -4;
  }
  local_300 = ParseEXRHeaderFromFile
                        (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                         (char *)in_stack_fffffffffffffc78,(char **)in_stack_fffffffffffffc70);
  if (local_300 != 0) {
    FreeEXRHeader(in_stack_fffffffffffffb08);
    return local_300;
  }
  for (local_304 = 0; local_304 < local_b0; local_304 = local_304 + 1) {
    if (*(int *)(local_b8 + (long)local_304 * 4) == 1) {
      *(undefined4 *)(local_a8 + (long)local_304 * 4) = 2;
    }
  }
  local_308 = LoadEXRImageFromFile
                        (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                         (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                         in_stack_fffffffffffffc60);
  if (local_308 != 0) {
    FreeEXRHeader(in_stack_fffffffffffffb08);
    return local_308;
  }
  local_30c = -1;
  local_310 = -1;
  local_314 = -1;
  local_318 = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1ded9e);
  tinyexr::GetLayers((EXRHeader *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     in_stack_fffffffffffffb88);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::vector
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)0x1dedbf);
  local_36a = 0;
  if (local_30 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,local_30,&local_36b);
  }
  else {
    std::allocator<char>::allocator();
    local_36a = 1;
    std::__cxx11::string::string(local_368,"",&local_369);
  }
  tinyexr::ChannelsInLayer
            ((EXRHeader *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
             (string *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string(local_368);
  if (local_30 != (char *)0x0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_36b);
  }
  if ((local_36a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
  }
  sVar8 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    (local_348);
  if (sVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffc70,"Layer Not Found",
               (allocator *)&stack0xfffffffffffffc6f);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffb10,(char **)in_stack_fffffffffffffb08);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc6f);
    FreeEXRHeader(in_stack_fffffffffffffb08);
    FreeEXRImage(in_stack_fffffffffffffb18);
    local_4 = -0xd;
    goto LAB_001dfd80;
  }
  sVar8 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    (local_348);
  if (sVar8 < 4) {
    local_4d0 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                          (local_348);
  }
  else {
    local_4d0 = 4;
  }
  for (local_3a8 = 0; local_3a8 < local_4d0; local_3a8 = local_3a8 + 1) {
    pvVar9 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::operator[]
                       (local_348,local_3a8);
    bVar2 = std::operator==(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
    if (bVar2) {
      local_30c = (int)pvVar9->index;
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
      if (bVar2) {
        local_310 = (int)pvVar9->index;
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
        if (bVar2) {
          local_314 = (int)pvVar9->index;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
          if (bVar2) {
            local_318 = (int)pvVar9->index;
          }
        }
      }
    }
  }
  sVar8 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    (local_348);
  if (sVar8 == 1) {
    pvVar9 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::front
                       ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                        in_stack_fffffffffffffb10);
    iVar6 = (int)pvVar9->index;
    pvVar10 = malloc((long)local_a0.width * 0x10 * (long)local_a0.height);
    *local_10 = (long)pvVar10;
    if (local_f0 == 0) {
      for (local_3dc = 0; local_3dc < local_a0.width * local_a0.height; local_3dc = local_3dc + 1) {
        local_3e0 = *(undefined4 *)(local_a0.images[iVar6] + (long)local_3dc * 4);
        *(undefined4 *)(*local_10 + (long)(local_3dc << 2) * 4) = local_3e0;
        *(undefined4 *)(*local_10 + (long)(local_3dc * 4 + 1) * 4) = local_3e0;
        *(undefined4 *)(*local_10 + (long)(local_3dc * 4 + 2) * 4) = local_3e0;
        *(undefined4 *)(*local_10 + (long)(local_3dc * 4 + 3) * 4) = local_3e0;
      }
    }
    else {
      for (local_3b8 = 0; local_3b8 < local_a0.num_tiles; local_3b8 = local_3b8 + 1) {
        for (iVar12 = 0; iVar12 < local_e8; iVar12 = iVar12 + 1) {
          for (iVar11 = 0; iVar11 < local_ec; iVar11 = iVar11 + 1) {
            iVar3 = local_a0.tiles[local_3b8].offset_x * local_ec + iVar11;
            iVar4 = local_a0.tiles[local_3b8].offset_y * local_e8 + iVar12;
            iVar5 = iVar3 + iVar4 * local_a0.width;
            if ((iVar3 < local_a0.width) && (iVar4 < local_a0.height)) {
              iVar3 = iVar11 + iVar12 * local_ec;
              local_3d8 = local_a0.tiles[local_3b8].images;
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4) * 4) =
                   *(undefined4 *)(local_3d8[iVar6] + (long)iVar3 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4 + 1) * 4) =
                   *(undefined4 *)(local_3d8[iVar6] + (long)iVar3 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4 + 2) * 4) =
                   *(undefined4 *)(local_3d8[iVar6] + (long)iVar3 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4 + 3) * 4) =
                   *(undefined4 *)(local_3d8[iVar6] + (long)iVar3 * 4);
            }
          }
        }
      }
    }
  }
  else {
    if (local_30c == -1) {
      in_stack_fffffffffffffb20 = &local_401;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,"R channel not found",in_stack_fffffffffffffb20);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffb10,(char **)in_stack_fffffffffffffb08);
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      FreeEXRHeader(in_stack_fffffffffffffb08);
      FreeEXRImage(in_stack_fffffffffffffb18);
      local_4 = -4;
      goto LAB_001dfd80;
    }
    if (local_310 == -1) {
      exr_image_00 = (EXRImage *)local_429;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_429 + 1),"G channel not found",(allocator *)exr_image_00);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffb10,(char **)in_stack_fffffffffffffb08);
      std::__cxx11::string::~string((string *)(local_429 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_429);
      FreeEXRHeader(in_stack_fffffffffffffb08);
      FreeEXRImage(exr_image_00);
      local_4 = -4;
      goto LAB_001dfd80;
    }
    if (local_314 == -1) {
      msg = (string *)local_451;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_451 + 1),"B channel not found",(allocator *)msg)
      ;
      tinyexr::SetErrorMessage(msg,(char **)in_stack_fffffffffffffb08);
      std::__cxx11::string::~string((string *)(local_451 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_451);
      FreeEXRHeader(in_stack_fffffffffffffb08);
      FreeEXRImage(in_stack_fffffffffffffb18);
      local_4 = -4;
      goto LAB_001dfd80;
    }
    pvVar10 = malloc((long)local_a0.width * 0x10 * (long)local_a0.height);
    *local_10 = (long)pvVar10;
    if (local_f0 == 0) {
      for (local_47c = 0; local_47c < local_a0.width * local_a0.height; local_47c = local_47c + 1) {
        *(undefined4 *)(*local_10 + (long)(local_47c << 2) * 4) =
             *(undefined4 *)(local_a0.images[local_30c] + (long)local_47c * 4);
        *(undefined4 *)(*local_10 + (long)(local_47c * 4 + 1) * 4) =
             *(undefined4 *)(local_a0.images[local_310] + (long)local_47c * 4);
        *(undefined4 *)(*local_10 + (long)(local_47c * 4 + 2) * 4) =
             *(undefined4 *)(local_a0.images[local_314] + (long)local_47c * 4);
        if (local_318 == -1) {
          *(undefined4 *)(*local_10 + (long)(local_47c * 4 + 3) * 4) = 0x3f800000;
        }
        else {
          *(undefined4 *)(*local_10 + (long)(local_47c * 4 + 3) * 4) =
               *(undefined4 *)(local_a0.images[local_318] + (long)local_47c * 4);
        }
      }
    }
    else {
      for (local_458 = 0; local_458 < local_a0.num_tiles; local_458 = local_458 + 1) {
        for (local_45c = 0; local_45c < local_e8; local_45c = local_45c + 1) {
          for (local_460 = 0; local_460 < local_ec; local_460 = local_460 + 1) {
            iVar6 = local_a0.tiles[local_458].offset_x * local_ec + local_460;
            iVar12 = local_a0.tiles[local_458].offset_y * local_e8 + local_45c;
            iVar11 = iVar6 + iVar12 * local_a0.width;
            if ((iVar6 < local_a0.width) && (iVar12 < local_a0.height)) {
              iVar6 = local_460 + local_45c * local_ec;
              ppuVar1 = local_a0.tiles[local_458].images;
              *(undefined4 *)(*local_10 + (long)(iVar11 * 4) * 4) =
                   *(undefined4 *)(ppuVar1[local_30c] + (long)iVar6 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 1) * 4) =
                   *(undefined4 *)(ppuVar1[local_310] + (long)iVar6 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 2) * 4) =
                   *(undefined4 *)(ppuVar1[local_314] + (long)iVar6 * 4);
              if (local_318 == -1) {
                *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 3) * 4) = 0x3f800000;
              }
              else {
                *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 3) * 4) =
                     *(undefined4 *)(ppuVar1[local_318] + (long)iVar6 * 4);
              }
            }
          }
        }
      }
    }
  }
  *local_18 = local_a0.width;
  *local_20 = local_a0.height;
  FreeEXRHeader(in_stack_fffffffffffffb08);
  FreeEXRImage(in_stack_fffffffffffffb18);
  local_4 = 0;
LAB_001dfd80:
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
             in_stack_fffffffffffffb20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb20);
  return local_4;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}